

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.h
# Opt level: O0

socklen_t __thiscall hwnet::Addr::AddrLen(Addr *this)

{
  Addr *this_local;
  
  if (this->addrType == 1) {
    this_local._4_4_ = 0x10;
  }
  else if (this->addrType == 2) {
    this_local._4_4_ = 0x1c;
  }
  else if (this->addrType == 3) {
    this_local._4_4_ = 0x6e;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

socklen_t AddrLen() const {
		if(this->addrType == SOCK_ADDR_IPV4) {
    		return sizeof(this->sockaddr.in);
    	} else if(this->addrType == SOCK_ADDR_IPV6) {
    		return sizeof(this->sockaddr.in6);
    	} else if(this->addrType == SOCK_ADDR_UNIX) {
    		return sizeof(this->sockaddr.un);
    	} else {
    		return 0;
    	}
    }